

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O1

bool __thiscall
bssl::CertPathIter::GetNextPath
          (CertPathIter *this,ParsedCertificateList *out_certs,CertificateTrust *out_last_cert_trust
          ,CertPathErrors *out_errors,CertPathBuilderDelegate *delegate,uint32_t *iteration_count,
          uint32_t max_iteration_count,uint32_t max_path_building_depth)

{
  size_t *psVar1;
  pointer *ppuVar2;
  uint uVar3;
  CertificateTrustType CVar4;
  CertIssuersIter *pCVar5;
  pointer ppCVar6;
  pointer puVar7;
  pointer pIVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  size_t sVar10;
  element_type *peVar11;
  TrustStore *pTVar12;
  unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
  *puVar13;
  unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
  *puVar14;
  pointer puVar15;
  _anonymous_namespace_ *p_Var16;
  char cVar17;
  bool bVar18;
  int iVar19;
  long lVar20;
  CertIssuersIter *pCVar21;
  undefined4 extraout_var;
  const_iterator cVar22;
  ulong uVar23;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  CertErrors *pCVar25;
  long *plVar26;
  _Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
  *p_Var27;
  CertIssuersIter *pCVar28;
  _Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *p_Var29;
  pointer psVar30;
  undefined **ppuVar31;
  __uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
  _Var32;
  char *pcVar33;
  ParsedCertificate *cert;
  ParsedCertificate *extraout_RDX;
  ParsedCertificate *extraout_RDX_00;
  ParsedCertificate *extraout_RDX_01;
  ParsedCertificate *extraout_RDX_02;
  ParsedCertificate *extraout_RDX_03;
  ParsedCertificate *pPVar34;
  ParsedCertificateList *certs;
  ParsedCertificateList *certs_00;
  ParsedCertificateList *certs_01;
  pointer pIVar35;
  pointer ppCVar36;
  pointer puVar37;
  _Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
  *this_00;
  CertPathErrors *this_01;
  pointer *__ptr;
  _Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> _Var38;
  unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
  *this_02;
  CertIssuersIter *pCVar39;
  _Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
  _Var40;
  ulong uVar41;
  pair<std::_Rb_tree_iterator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_bool>
  pVar42;
  undefined1 local_138 [24];
  _Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
  _Stack_120;
  size_type local_118;
  pointer local_110;
  string local_100;
  CertIssuerIterPath *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_d8;
  _anonymous_namespace_ *local_d0;
  _Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> local_c8;
  CertPathErrors *local_c0;
  CertPathBuilderDelegate *local_b8;
  _Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
  *local_b0;
  pointer local_a8;
  undefined1 local_a0 [24];
  undefined4 uStack_88;
  undefined4 uStack_84;
  unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
  *local_80;
  long local_78;
  unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
  local_70 [2];
  CertIssuerSources *local_60;
  CertificateTrust *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_50;
  CertificateTrust *local_48;
  _Base_ptr local_40;
  uint *local_38;
  
  local_d0 = (_anonymous_namespace_ *)out_certs;
  local_c0 = out_errors;
  local_38 = iteration_count;
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::clear(out_certs);
  out_last_cert_trust->type = UNSPECIFIED;
  out_last_cert_trust->enforce_anchor_expiry = false;
  out_last_cert_trust->enforce_anchor_constraints = false;
  out_last_cert_trust->require_anchor_basic_constraints = false;
  out_last_cert_trust->require_leaf_selfsigned = false;
  local_48 = out_last_cert_trust;
  iVar19 = (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
             [7])(delegate);
  if ((char)iVar19 == '\0') {
    local_e0 = &this->cur_path_;
    local_50 = &(this->next_issuer_).cert.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    local_58 = &(this->next_issuer_).trust;
    this_00 = (_Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
               *)&(this->cur_path_).present_certs_;
    local_40 = &(this->cur_path_).present_certs_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60 = &this->cert_issuer_sources_;
    local_b8 = delegate;
    local_b0 = this_00;
    while ((p_Var16 = local_d0, max_path_building_depth == 0 ||
           ((ulong)((long)(this->cur_path_).cur_path_.
                          super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->cur_path_).cur_path_.
                          super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <
            (ulong)max_path_building_depth))) {
      if ((this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        puVar37 = (this->cur_path_).cur_path_.
                  super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->cur_path_).cur_path_.
            super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == puVar37) {
          iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar19 != '\0') {
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,0x23,"CertPathIter exhausted all paths...");
          }
          goto LAB_004b71ce;
        }
        uVar3 = *local_38;
        *local_38 = uVar3 + 1;
        if (max_iteration_count < uVar3 + 1 && max_iteration_count != 0) {
          anon_unknown_6::CertIssuerIterPath::CopyPath(local_e0,(ParsedCertificateList *)local_d0);
          pCVar25 = CertPathErrors::GetOtherErrors(local_c0);
          ppuVar31 = &cert_errors::kIterationLimitExceeded;
          goto LAB_004b71c3;
        }
        pCVar5 = puVar37[-1]._M_t.
                 super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                 .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
                 _M_head_impl;
        if (pCVar5->did_initial_query_ == false) {
          pCVar5->did_initial_query_ = true;
          ppCVar6 = (pCVar5->cert_issuer_sources_->
                    super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (ppCVar36 = (pCVar5->cert_issuer_sources_->
                          super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                          )._M_impl.super__Vector_impl_data._M_start; ppCVar36 != ppCVar6;
              ppCVar36 = ppCVar36 + 1) {
            local_138._0_8_ =
                 (__uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                  )0x0;
            local_138._8_8_ = (pointer)0x0;
            local_138._16_8_ = (pointer)0x0;
            (*(*ppCVar36)->_vptr_CertIssuerSource[2])
                      (*ppCVar36,
                       (pCVar5->cert_).
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,local_138);
            local_100._M_dataplus._M_p = (pointer)local_138._0_8_;
            local_100._M_string_length = local_138._8_8_;
            local_100.field_2._M_allocated_capacity = local_138._16_8_;
            local_138._0_8_ = (Request *)0x0;
            local_138._8_8_ = (pointer)0x0;
            local_138._16_8_ = (CertIssuersIter *)0x0;
            anon_unknown_6::CertIssuersIter::AddIssuers(pCVar5,(ParsedCertificateList *)&local_100);
            ::std::
            vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       *)&local_100);
            ::std::
            vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       *)local_138);
          }
        }
        if ((ulong)((long)(pCVar5->issuers_).
                          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar5->issuers_).
                          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= pCVar5->cur_issuer_) {
          if (pCVar5->did_async_issuer_query_ == false) {
            pCVar5->did_async_issuer_query_ = true;
            pCVar5->cur_async_request_ = 0;
            ppCVar36 = (pCVar5->cert_issuer_sources_->
                       super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            ppCVar6 = (pCVar5->cert_issuer_sources_->
                      super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            if (ppCVar36 != ppCVar6) {
              do {
                local_138._0_8_ =
                     (__uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                      )0x0;
                (*(*ppCVar36)->_vptr_CertIssuerSource[3])
                          (*ppCVar36,
                           (pCVar5->cert_).
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,local_138);
                if ((_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)local_138._0_8_ !=
                    (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)0x0) {
                  ::std::
                  vector<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>,std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>>
                  ::
                  emplace_back<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>
                            ((vector<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>,std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>>
                              *)&pCVar5->pending_async_requests_,
                             (unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                              *)local_138);
                }
                if ((_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                    local_138._0_8_ !=
                    (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)0x0) {
                  (**(code **)((long)(((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                                        *)local_138._0_8_)->
                                     super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                                     )._M_t + 8))();
                }
                ppCVar36 = ppCVar36 + 1;
              } while (ppCVar36 != ppCVar6);
            }
          }
          if ((ulong)((long)(pCVar5->issuers_).
                            super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar5->issuers_).
                            super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= pCVar5->cur_issuer_)
          {
            do {
              puVar7 = (pCVar5->pending_async_requests_).
                       super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pCVar5->pending_async_requests_).
                                super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3) <=
                  pCVar5->cur_async_request_) break;
              local_138._0_8_ =
                   (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)0x0;
              local_138._8_8_ = (pointer)0x0;
              local_138._16_8_ = (CertIssuersIter *)0x0;
              _Var32._M_t.
              super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
              .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                   puVar7[pCVar5->cur_async_request_]._M_t.
                   super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   ._M_t;
              (**(code **)(*(long *)_Var32._M_t.
                                    super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                    .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                    ._M_head_impl + 0x10))
                        (_Var32._M_t.
                         super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                         .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                         _M_head_impl,local_138);
              if (local_138._0_8_ == local_138._8_8_) {
                sVar10 = pCVar5->cur_async_request_;
                puVar7 = (pCVar5->pending_async_requests_).
                         super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pCVar5->cur_async_request_ = sVar10 + 1;
                _Var32._M_t.
                super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                     puVar7[sVar10]._M_t.
                     super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                     ._M_t;
                puVar7[sVar10]._M_t.
                super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                ._M_t = (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                         )0x0;
                if ((_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                     )_Var32._M_t.
                      super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                      .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl
                    != (Request *)0x0) {
                  (**(code **)(*(long *)_Var32._M_t.
                                        super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                        .
                                        super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                        ._M_head_impl + 8))();
                }
              }
              else {
                local_a0._0_8_ = local_138._0_8_;
                local_a0._8_8_ = local_138._8_8_;
                local_a0._16_8_ = local_138._16_8_;
                local_138._0_8_ =
                     (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)0x0;
                local_138._8_8_ = (pointer)0x0;
                local_138._16_8_ = (CertIssuersIter *)0x0;
                anon_unknown_6::CertIssuersIter::AddIssuers
                          (pCVar5,(vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                   *)local_a0);
                ::std::
                vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                           *)local_a0);
              }
              ::std::
              vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                         *)local_138);
            } while ((ulong)((long)(pCVar5->issuers_).
                                   super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pCVar5->issuers_).
                                   super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5) <=
                     pCVar5->cur_issuer_);
          }
        }
        pIVar35 = (pCVar5->issuers_).
                  super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar8 = (pCVar5->issuers_).
                 super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pCVar39 = (CertIssuersIter *)(local_138 + 0x10);
        if (pCVar5->cur_issuer_ < (ulong)((long)pIVar8 - (long)pIVar35 >> 5)) {
          if (pCVar5->issuers_needs_sort_ == true) {
            pIVar35 = pIVar35 + pCVar5->cur_issuer_;
            if (pIVar35 != pIVar8) {
              local_a8 = pIVar8;
              lVar20 = (long)pIVar8 - (long)pIVar35 >> 5;
              local_138._0_8_ = (lVar20 - (lVar20 + 1 >> 0x3f)) + 1 >> 1;
              _Var38._M_head_impl = (Request *)local_138._0_8_;
              if (0x3fffffffffffffe < (long)local_138._0_8_) {
                _Var38._M_head_impl = (Request *)0x3ffffffffffffff;
              }
              local_138._8_8_ = (pointer)0x0;
              local_138._16_8_ = (CertIssuersIter *)0x0;
              do {
                if ((long)_Var38._M_head_impl < 1) {
                  pCVar39 = (CertIssuersIter *)0x0;
                  local_d8 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  break;
                }
                pCVar21 = (CertIssuersIter *)
                          operator_new((long)_Var38._M_head_impl << 5,(nothrow_t *)&::std::nothrow);
                if (pCVar21 == (CertIssuersIter *)0x0) {
                  if ((_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                      _Var38._M_head_impl ==
                      (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)0x1)
                  {
                    _Var38._M_head_impl = (Request *)0x0;
                  }
                  else {
                    _Var38._M_head_impl =
                         (Request *)
                         ((ulong)((long)&(((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                                            *)&(_Var38._M_head_impl)->_vptr_Request)->
                                         super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                                         )._M_t.
                                         super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                                         .
                                         super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>
                                         ._M_head_impl + 1U) >> 1);
                  }
                }
                else {
                  local_d8 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)_Var38._M_head_impl;
                  pCVar39 = pCVar21;
                }
              } while (pCVar21 == (CertIssuersIter *)0x0);
              p_Var24 = local_d8;
              if (pCVar39 != (CertIssuersIter *)0x0) {
                if ((pointer)local_d8 != (pointer)0x0) {
                  (pCVar39->cert_).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (pIVar35->cert).
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  (pCVar39->cert_).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var9 = (pIVar35->cert).
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pIVar35->cert).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  (pCVar39->cert_).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = p_Var9;
                  (pIVar35->cert).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  *(int *)&pCVar39->trust_store_ = pIVar35->trust_and_key_id_match_ordering;
                  pCVar39->cert_issuer_sources_ = (CertIssuerSources *)pIVar35->trust;
                  pCVar21 = pCVar39;
                  if ((pointer)p_Var24 != (pointer)0x1) {
                    lVar20 = (long)local_d8 * 0x20 + -0x20;
                    pCVar28 = pCVar39;
                    do {
                      pCVar21 = (CertIssuersIter *)&pCVar28->issuers_;
                      pIVar8 = (pointer)(pCVar28->cert_).
                                        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                      *(element_type **)
                       &(pCVar28->issuers_).
                        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                           = (pCVar28->cert_).
                             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                      (pCVar28->issuers_).
                      super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish = pIVar8;
                      (pCVar28->cert_).
                      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr = (element_type *)0x0;
                      (pCVar28->cert_).
                      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      (pCVar28->issuers_).
                      super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)pCVar28->cert_issuer_sources_;
                      *(undefined4 *)&pCVar28->cur_issuer_ = *(undefined4 *)&pCVar28->trust_store_;
                      lVar20 = lVar20 + -0x20;
                      pCVar28 = pCVar21;
                    } while (lVar20 != 0);
                  }
                  peVar11 = (element_type *)
                            (((_Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                               *)&pCVar21->cert_)->_M_impl).super__Vector_impl_data._M_start;
                  pIVar8 = (((_Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                              *)&pCVar21->cert_)->_M_impl).super__Vector_impl_data._M_finish;
                  (((_Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                     *)&pCVar21->cert_)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
                  (((_Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                     *)&pCVar21->cert_)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
                  p_Var9 = (pIVar35->cert).
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pIVar35->cert).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = peVar11;
                  (pIVar35->cert).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar8;
                  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                  }
                  pIVar35->trust_and_key_id_match_ordering = *(int *)&pCVar21->trust_store_;
                  pIVar35->trust = (CertificateTrust)pCVar21->cert_issuer_sources_;
                }
                local_138._8_8_ = local_d8;
                local_138._16_8_ = pCVar39;
              }
              if ((CertIssuersIter *)local_138._16_8_ == (CertIssuersIter *)0x0) {
                ::std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry*,std::vector<bssl::(anonymous_namespace)::IssuerEntry,std::allocator<bssl::(anonymous_namespace)::IssuerEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<bssl::(anonymous_namespace)::CertIssuersIter::SortRemainingIssuers()::__0>>
                          (pIVar35,local_a8);
              }
              else {
                ::std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry*,std::vector<bssl::(anonymous_namespace)::IssuerEntry,std::allocator<bssl::(anonymous_namespace)::IssuerEntry>>>,bssl::(anonymous_namespace)::IssuerEntry*,long,__gnu_cxx::__ops::_Iter_comp_iter<bssl::(anonymous_namespace)::CertIssuersIter::SortRemainingIssuers()::__0>>
                          (pIVar35,local_a8,local_138._16_8_,local_138._8_8_);
              }
              ::std::
              _Temporary_buffer<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry_*,_std::vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>_>,_bssl::(anonymous_namespace)::IssuerEntry>
              ::~_Temporary_buffer
                        ((_Temporary_buffer<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry_*,_std::vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>_>,_bssl::(anonymous_namespace)::IssuerEntry>
                          *)local_138);
            }
            pCVar5->issuers_needs_sort_ = false;
          }
          pIVar35 = (pCVar5->issuers_).
                    super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          sVar10 = pCVar5->cur_issuer_;
          pCVar5->cur_issuer_ = sVar10 + 1;
          pIVar35 = pIVar35 + sVar10;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pIVar35->cert).
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_50,&(pIVar35->cert).
                               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
          *local_58 = pIVar35->trust;
          local_58[1].type = pIVar35->trust_and_key_id_match_ordering;
        }
        else {
          p_Var9 = (this->next_issuer_).cert.
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          (this->next_issuer_).trust.type = UNSPECIFIED;
          (this->next_issuer_).trust.enforce_anchor_expiry = false;
          (this->next_issuer_).trust.enforce_anchor_constraints = false;
          (this->next_issuer_).trust.require_anchor_basic_constraints = false;
          (this->next_issuer_).trust.require_leaf_selfsigned = false;
          (this->next_issuer_).trust_and_key_id_match_ordering = 0;
        }
        this_00 = local_b0;
        delegate = local_b8;
        p_Var16 = local_d0;
        if ((this->next_issuer_).cert.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) goto LAB_004b6aa2;
        pCVar5 = (this->cur_path_).cur_path_.
                 super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                 .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
                 _M_head_impl;
        if ((ulong)((long)(pCVar5->issuers_).
                          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    *(long *)&(pCVar5->issuers_).
                              super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                              ._M_impl >> 5) <= pCVar5->skipped_issuer_count_) {
          anon_unknown_6::CertIssuerIterPath::CopyPath(local_e0,(ParsedCertificateList *)local_d0);
          pCVar25 = CertPathErrors::GetErrorsForCert
                              (local_c0,(*(long *)(p_Var16 + 8) - *(long *)p_Var16 >> 4) - 1);
          CertErrors::AddError(pCVar25,"No matching issuer found");
          iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar19 != '\0') {
            (anonymous_namespace)::PathDebugString_abi_cxx11_(&local_100,p_Var16,certs_01);
            plVar26 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_100,0,(char *)0x0,0x5a78bd);
            p_Var29 = (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                      (plVar26 + 2);
            if ((_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)*plVar26
                == p_Var29) {
              local_138._16_8_ =
                   (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                      *)&p_Var29->_M_head_impl)->
                   super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                   )._M_t;
              _Stack_120.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
              _M_head_impl = (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)plVar26[3];
              local_138._0_8_ = (Request *)(local_138 + 0x10);
            }
            else {
              local_138._16_8_ =
                   (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                      *)&p_Var29->_M_head_impl)->
                   super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                   )._M_t;
              local_138._0_8_ = (Request *)*plVar26;
            }
            local_138._8_8_ = plVar26[1];
            *plVar26 = (long)p_Var29;
            plVar26[1] = 0;
            *(undefined1 *)(plVar26 + 2) = 0;
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,local_138._8_8_,local_138._0_8_);
            goto LAB_004b74a1;
          }
          goto LAB_004b74d3;
        }
        iVar19 = (*(local_b8->super_VerifyCertificateChainDelegate).
                   _vptr_VerifyCertificateChainDelegate[8])(local_b8);
        if ((char)iVar19 != '\0') {
          (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9]
          )(delegate,0x1c,"CertPathIter backtracking...");
        }
        anon_unknown_6::CertIssuerIterPath::Pop(local_e0);
      }
      else {
LAB_004b6aa2:
        _Var40.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
             (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)((long)local_138 + 0x10);
        CVar4 = (this->next_issuer_).trust.type;
        if (CVar4 == TRUSTED_LEAF) {
          if ((this->cur_path_).cur_path_.
              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->cur_path_).cur_path_.
              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                       _vptr_VerifyCertificateChainDelegate[8])(delegate);
            cVar17 = (char)iVar19;
            pcVar33 = "Issuer is a trust leaf, considering as UNSPECIFIED";
            goto LAB_004b6ae6;
          }
        }
        else if ((CVar4 == LAST) &&
                ((this->cur_path_).cur_path_.
                 super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 (this->cur_path_).cur_path_.
                 super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
          iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          cVar17 = (char)iVar19;
          pcVar33 = "Leaf is a trust anchor, considering as UNSPECIFIED";
LAB_004b6ae6:
          if (cVar17 != '\0') {
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,0x32,pcVar33);
          }
          (this->next_issuer_).trust.type = UNSPECIFIED;
          (this->next_issuer_).trust.enforce_anchor_expiry = false;
          (this->next_issuer_).trust.enforce_anchor_constraints = false;
          (this->next_issuer_).trust.require_anchor_basic_constraints = false;
          (this->next_issuer_).trust.require_leaf_selfsigned = false;
        }
        if ((((this->next_issuer_).trust.type - TRUSTED_ANCHOR_OR_LEAF < 2) &&
            ((this->cur_path_).cur_path_.
             super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->cur_path_).cur_path_.
             super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) &&
           ((this->next_issuer_).trust.require_leaf_selfsigned == true)) {
          pPVar34 = (this->next_issuer_).cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[2])(delegate);
          this_00 = local_b0;
          bVar18 = VerifyCertificateIsSelfSigned
                             (pPVar34,(SignatureVerifyCache *)CONCAT44(extraout_var,iVar19),
                              (CertErrors *)0x0);
          if (!bVar18) {
            iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                       _vptr_VerifyCertificateChainDelegate[8])(delegate);
            if ((char)iVar19 != '\0') {
              (*(delegate->super_VerifyCertificateChainDelegate).
                _vptr_VerifyCertificateChainDelegate[9])
                        (delegate,0x5f,
                         "Leaf is trusted with require_leaf_selfsigned but is not self-signed, considering as UNSPECIFIED"
                        );
            }
            (this->next_issuer_).trust.type = UNSPECIFIED;
            (this->next_issuer_).trust.enforce_anchor_expiry = false;
            (this->next_issuer_).trust.enforce_anchor_constraints = false;
            (this->next_issuer_).trust.require_anchor_basic_constraints = false;
            (this->next_issuer_).trust.require_leaf_selfsigned = false;
          }
        }
        p_Var16 = local_d0;
        CVar4 = (this->next_issuer_).trust.type;
        if (CVar4 == UNSPECIFIED) {
          peVar11 = (this->next_issuer_).cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          local_110 = (peVar11->normalized_subject_)._M_dataplus._M_p;
          local_118 = (peVar11->normalized_subject_)._M_string_length;
          _Stack_120.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
               (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)
               (peVar11->subject_alt_names_extension_).value.data_.data_;
          local_138._16_8_ = (peVar11->subject_alt_names_extension_).value.data_.size_;
          local_138._8_8_ = (peVar11->tbs_).spki_tlv.data_.data_;
          local_138._0_8_ = (peVar11->tbs_).spki_tlv.data_.size_;
          cVar22 = ::std::
                   _Rb_tree<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Identity<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ::find((_Rb_tree<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Identity<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           *)this_00,(key_type *)local_138);
          if (cVar22._M_node == local_40) {
            local_c8._M_head_impl = (CertIssuersIter *)operator_new(0xb0);
            peVar11 = (this->next_issuer_).cert.
                      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            p_Var9 = (this->next_issuer_).cert.
                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (this->next_issuer_).cert.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (this->next_issuer_).cert.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pTVar12 = this->trust_store_;
            ((local_c8._M_head_impl)->cert_).
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar11;
            ((local_c8._M_head_impl)->cert_).
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = p_Var9;
            (local_c8._M_head_impl)->cert_issuer_sources_ = local_60;
            (local_c8._M_head_impl)->trust_store_ = pTVar12;
            ((local_c8._M_head_impl)->issuers_).
            super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ((local_c8._M_head_impl)->issuers_).
            super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((local_c8._M_head_impl)->issuers_).
            super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (local_c8._M_head_impl)->cur_issuer_ = 0;
            *(undefined8 *)((long)&(local_c8._M_head_impl)->cur_issuer_ + 1) = 0;
            *(undefined8 *)((long)&(local_c8._M_head_impl)->skipped_issuer_count_ + 1) = 0;
            ((local_c8._M_head_impl)->present_issuers_)._M_h._M_buckets =
                 &((local_c8._M_head_impl)->present_issuers_)._M_h._M_single_bucket;
            ((local_c8._M_head_impl)->present_issuers_)._M_h._M_bucket_count = 1;
            ((local_c8._M_head_impl)->present_issuers_)._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)0x0;
            ((local_c8._M_head_impl)->present_issuers_)._M_h._M_element_count = 0;
            ((local_c8._M_head_impl)->present_issuers_)._M_h._M_rehash_policy._M_max_load_factor =
                 1.0;
            ((local_c8._M_head_impl)->present_issuers_)._M_h._M_rehash_policy._M_next_resize = 0;
            ((local_c8._M_head_impl)->present_issuers_)._M_h._M_single_bucket = (__node_base_ptr)0x0
            ;
            (local_c8._M_head_impl)->did_initial_query_ = false;
            (local_c8._M_head_impl)->did_async_issuer_query_ = false;
            (local_c8._M_head_impl)->cur_async_request_ = 0;
            ((local_c8._M_head_impl)->pending_async_requests_).
            super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ((local_c8._M_head_impl)->pending_async_requests_).
            super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((local_c8._M_head_impl)->pending_async_requests_).
            super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_110 = (peVar11->normalized_subject_)._M_dataplus._M_p;
            local_118 = (peVar11->normalized_subject_)._M_string_length;
            _Stack_120.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl
                 = (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)
                   (peVar11->subject_alt_names_extension_).value.data_.data_;
            local_138._16_8_ = (peVar11->subject_alt_names_extension_).value.data_.size_;
            local_138._8_8_ = (peVar11->tbs_).spki_tlv.data_.data_;
            local_138._0_8_ = (peVar11->tbs_).spki_tlv.data_.size_;
            pVar42 = ::std::
                     _Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
                     ::
                     _M_insert_unique<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>
                               (this_00,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)local_138);
            if (((undefined1  [16])pVar42 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              abort();
            }
            puVar13 = (this->cur_path_).cur_path_.
                      super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (puVar13 ==
                (this->cur_path_).cur_path_.
                super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              puVar14 = (this->cur_path_).cur_path_.
                        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((long)puVar13 - (long)puVar14 == 0x7ffffffffffffff8) {
                ::std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar41 = (long)puVar13 - (long)puVar14 >> 3;
              uVar23 = uVar41;
              if (puVar13 == puVar14) {
                uVar23 = 1;
              }
              local_a8 = (pointer)(uVar23 + uVar41);
              if ((pointer)0xffffffffffffffe < local_a8) {
                local_a8 = (pointer)0xfffffffffffffff;
              }
              if (CARRY8(uVar23,uVar41)) {
                local_a8 = (pointer)0xfffffffffffffff;
              }
              if (local_a8 == (pointer)0x0) {
                p_Var24 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                p_Var24 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                          operator_new((long)local_a8 * 8);
              }
              (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                 *)&p_Var24[uVar41]._M_pi)->
              super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              )._M_t = (tuple<bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                        )local_c8._M_head_impl;
              local_c8._M_head_impl = (CertIssuersIter *)0x0;
              local_d8 = p_Var24;
              for (this_02 = puVar14; puVar13 != this_02; this_02 = this_02 + 1) {
                (((__uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                   *)&((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
                      &p_Var24->_M_pi)->_M_ptr)->_M_t).
                super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                     = (_Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                        )(this_02->_M_t).
                         super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                         .
                         super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>
                         ._M_head_impl;
                (this_02->_M_t).
                super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                ._M_t.
                super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
                _M_head_impl = (CertIssuersIter *)0x0;
                ::std::
                unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                ::~unique_ptr(this_02);
                p_Var24 = p_Var24 + 1;
              }
              if (puVar14 !=
                  (unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                   *)0x0) {
                operator_delete(puVar14,(long)(this->cur_path_).cur_path_.
                                              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)puVar14);
              }
              (this->cur_path_).cur_path_.
              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8;
              (this->cur_path_).cur_path_.
              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)(p_Var24 + 1);
              (this->cur_path_).cur_path_.
              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((__uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                              *)&((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                   *)&local_d8->_M_pi)->_M_ptr + (long)local_a8);
            }
            else {
              (puVar13->_M_t).
              super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              ._M_t.
              super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
              _M_head_impl = local_c8._M_head_impl;
              local_c8._M_head_impl = (CertIssuersIter *)0x0;
              ppuVar2 = &(this->cur_path_).cur_path_.
                         super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppuVar2 = *ppuVar2 + 1;
            }
            delegate = local_b8;
            ::std::
            unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
            ::~unique_ptr((unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                           *)&local_c8);
            this_00 = local_b0;
            p_Var9 = (this->next_issuer_).cert.
                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (this->next_issuer_).cert.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (this->next_issuer_).cert.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            (this->next_issuer_).trust.type = UNSPECIFIED;
            (this->next_issuer_).trust.enforce_anchor_expiry = false;
            (this->next_issuer_).trust.enforce_anchor_constraints = false;
            (this->next_issuer_).trust.require_anchor_basic_constraints = false;
            (this->next_issuer_).trust.require_leaf_selfsigned = false;
            (this->next_issuer_).trust_and_key_id_match_ordering = 0;
            iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                       _vptr_VerifyCertificateChainDelegate[8])(delegate);
            if ((char)iVar19 != '\0') {
              local_80 = local_70;
              local_78 = 0;
              local_70[0]._M_t.
              super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
              ._M_t.
              super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
              .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl._0_1_ =
                   0;
              puVar15 = (this->cur_path_).cur_path_.
                        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pPVar34 = extraout_RDX;
              for (puVar37 = (this->cur_path_).cur_path_.
                             super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; puVar37 != puVar15;
                  puVar37 = puVar37 + 1) {
                if (local_78 != 0) {
                  ::std::__cxx11::string::append((char *)&local_80);
                  pPVar34 = extraout_RDX_00;
                }
                (anonymous_namespace)::CertDebugString_abi_cxx11_
                          (&local_100,
                           *(_anonymous_namespace_ **)
                            &(((puVar37->_M_t).
                               super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                               .
                               super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>
                              ._M_head_impl)->cert_).
                             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ,pPVar34);
                plVar26 = (long *)::std::__cxx11::string::replace
                                            ((ulong)&local_100,0,(char *)0x0,0x5a401a);
                p_Var29 = (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                          (plVar26 + 2);
                if ((_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                    *plVar26 == p_Var29) {
                  local_138._16_8_ =
                       (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                          *)&p_Var29->_M_head_impl)->
                       super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                       )._M_t;
                  _Stack_120.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                  _M_head_impl = (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)
                                 plVar26[3];
                  local_138._0_8_ = (long)local_138 + 0x10;
                }
                else {
                  local_138._16_8_ =
                       (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                          *)&p_Var29->_M_head_impl)->
                       super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                       )._M_t;
                  local_138._0_8_ =
                       (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                       *plVar26;
                }
                local_138._8_8_ = plVar26[1];
                *plVar26 = (long)p_Var29;
                plVar26[1] = 0;
                *(undefined1 *)(plVar26 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)&local_80,local_138._0_8_);
                pPVar34 = extraout_RDX_01;
                if (local_138._0_8_ != (long)local_138 + 0x10) {
                  operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
                  pPVar34 = extraout_RDX_02;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  (ulong)(local_100.field_2._M_allocated_capacity + 1));
                  pPVar34 = extraout_RDX_03;
                }
              }
              plVar26 = (long *)::std::__cxx11::string::replace
                                          ((ulong)&local_80,0,(char *)0x0,0x5a7a17);
              this_00 = local_b0;
              delegate = local_b8;
              local_a0._0_8_ = local_a0 + 0x10;
              psVar30 = (pointer)(plVar26 + 2);
              if ((pointer)*plVar26 == psVar30) {
                local_a0._16_8_ =
                     (((__uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                        *)&(psVar30->
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->_M_t).
                     super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                ;
                uStack_88 = (undefined4)plVar26[3];
                uStack_84 = *(undefined4 *)((long)plVar26 + 0x1c);
              }
              else {
                local_a0._16_8_ =
                     (((__uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                        *)&(psVar30->
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->_M_t).
                     super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                ;
                local_a0._0_8_ = (pointer)*plVar26;
              }
              local_a0._8_8_ = plVar26[1];
              *plVar26 = (long)psVar30;
              plVar26[1] = 0;
              *(undefined1 *)(plVar26 + 2) = 0;
              (*(local_b8->super_VerifyCertificateChainDelegate).
                _vptr_VerifyCertificateChainDelegate[9])(local_b8,local_a0._8_8_,local_a0._0_8_);
              if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
                operator_delete((void *)local_a0._0_8_,
                                (ulong)((long)&(((shared_ptr<const_bssl::ParsedCertificate> *)
                                                local_a0._16_8_)->
                                               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr + 1));
              }
              if (local_80 != local_70) {
                operator_delete(local_80,CONCAT71(local_70[0]._M_t.
                                                  super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                                  .
                                                  super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                                  ._M_head_impl._1_7_,
                                                  local_70[0]._M_t.
                                                  super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                                  .
                                                  super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                                  ._M_head_impl._0_1_) + 1);
              }
            }
          }
          else {
            psVar1 = &((this->cur_path_).cur_path_.
                       super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                       super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                       .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>
                      ._M_head_impl)->skipped_issuer_count_;
            *psVar1 = *psVar1 + 1;
            iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                       _vptr_VerifyCertificateChainDelegate[8])(delegate);
            if ((char)iVar19 != '\0') {
              (anonymous_namespace)::CertDebugString_abi_cxx11_
                        (&local_100,
                         (_anonymous_namespace_ *)
                         (this->next_issuer_).cert.
                         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,cert);
              plVar26 = (long *)::std::__cxx11::string::replace
                                          ((ulong)&local_100,0,(char *)0x0,0x5a79f5);
              p_Var29 = (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                        (plVar26 + 2);
              if ((_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)*plVar26
                  == p_Var29) {
                local_138._16_8_ =
                     (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                        *)&p_Var29->_M_head_impl)->
                     super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                     )._M_t;
                _Stack_120.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                _M_head_impl = (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)plVar26[3]
                ;
                local_138._0_8_ =
                     _Var40.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                     _M_head_impl;
              }
              else {
                local_138._16_8_ =
                     (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                        *)&p_Var29->_M_head_impl)->
                     super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                     )._M_t;
                local_138._0_8_ =
                     (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                     *plVar26;
              }
              local_138._8_8_ = plVar26[1];
              *plVar26 = (long)p_Var29;
              plVar26[1] = 0;
              *(undefined1 *)(plVar26 + 2) = 0;
              (*(delegate->super_VerifyCertificateChainDelegate).
                _vptr_VerifyCertificateChainDelegate[9])(delegate,local_138._8_8_,local_138._0_8_);
              if ((_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)local_138._0_8_ !=
                  _Var40.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                  _M_head_impl) {
                operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                (ulong)(local_100.field_2._M_allocated_capacity + 1));
              }
            }
            p_Var9 = (this->next_issuer_).cert.
                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (this->next_issuer_).cert.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (this->next_issuer_).cert.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            (this->next_issuer_).trust.type = UNSPECIFIED;
            (this->next_issuer_).trust.enforce_anchor_expiry = false;
            (this->next_issuer_).trust.enforce_anchor_constraints = false;
            (this->next_issuer_).trust.require_anchor_basic_constraints = false;
            (this->next_issuer_).trust.require_leaf_selfsigned = false;
            (this->next_issuer_).trust_and_key_id_match_ordering = 0;
          }
        }
        else if ((CVar4 - LAST < 3) || (CVar4 == DISTRUSTED)) {
          anon_unknown_6::CertIssuerIterPath::CopyPath(local_e0,(ParsedCertificateList *)local_d0);
          ::std::
          vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>
          ::emplace_back<std::shared_ptr<bssl::ParsedCertificate_const>>
                    ((vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>
                      *)p_Var16,(shared_ptr<const_bssl::ParsedCertificate> *)this);
          iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar19 != '\0') {
            (anonymous_namespace)::PathDebugString_abi_cxx11_(&local_100,p_Var16,certs);
            plVar26 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_100,0,(char *)0x0,0x5a79d7);
            p_Var29 = (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                      (plVar26 + 2);
            if ((_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)*plVar26
                == p_Var29) {
              local_138._16_8_ =
                   (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                      *)&p_Var29->_M_head_impl)->
                   super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                   )._M_t;
              _Stack_120.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
              _M_head_impl = (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)plVar26[3];
              local_138._0_8_ =
                   _Var40.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                   _M_head_impl;
            }
            else {
              local_138._16_8_ =
                   (((__uniq_ptr_data<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>,_true,_true>
                      *)&p_Var29->_M_head_impl)->
                   super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                   )._M_t;
              local_138._0_8_ =
                   (_Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> *)
                   *plVar26;
            }
            local_138._8_8_ = plVar26[1];
            *plVar26 = (long)p_Var29;
            plVar26[1] = 0;
            *(undefined1 *)(plVar26 + 2) = 0;
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,local_138._8_8_,local_138._0_8_);
            if ((_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)local_138._0_8_ !=
                _Var40.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl)
            {
              operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              (ulong)(local_100.field_2._M_allocated_capacity + 1));
            }
          }
          *local_48 = (this->next_issuer_).trust;
          p_Var9 = (this->next_issuer_).cert.
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          (this->next_issuer_).trust.type = UNSPECIFIED;
          (this->next_issuer_).trust.enforce_anchor_expiry = false;
          (this->next_issuer_).trust.enforce_anchor_constraints = false;
          (this->next_issuer_).trust.require_anchor_basic_constraints = false;
          (this->next_issuer_).trust.require_leaf_selfsigned = false;
          (this->next_issuer_).trust_and_key_id_match_ordering = 0;
          goto LAB_004b74dd;
        }
      }
      iVar19 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[7])(delegate);
      if ((char)iVar19 != '\0') goto LAB_004b6538;
    }
    anon_unknown_6::CertIssuerIterPath::CopyPath(local_e0,(ParsedCertificateList *)local_d0);
    pCVar25 = CertPathErrors::GetOtherErrors(local_c0);
    CertErrors::AddError(pCVar25,"Depth limit exceeded");
    iVar19 = (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
               [8])(delegate);
    if ((char)iVar19 != '\0') {
      (anonymous_namespace)::PathDebugString_abi_cxx11_(&local_100,p_Var16,certs_00);
      p_Var27 = (_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                 *)::std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x5a784d);
      _Var32._M_t.
      super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
      .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
           (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
            )(p_Var27 + 2);
      if ((tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
           )p_Var27->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> ==
          (_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
           )_Var32._M_t.
            super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
            .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl) {
        local_138._16_8_ =
             *(undefined8 *)
              _Var32._M_t.
              super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
              .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl;
        _Stack_120.super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
             p_Var27[3].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>;
        local_138._0_8_ = (long)local_138 + 0x10;
      }
      else {
        local_138._16_8_ =
             *(undefined8 *)
              _Var32._M_t.
              super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
              .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl;
        local_138._0_8_ =
             (Request *)p_Var27->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>;
      }
      local_138._8_8_ = p_Var27[1].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>;
      p_Var27->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> =
           (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)
           _Var32._M_t.
           super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
           .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl;
      p_Var27[1].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> = (Request *)0x0;
      *(undefined1 *)&p_Var27[2].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> = 0
      ;
      (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
                (delegate,local_138._8_8_,local_138._0_8_);
LAB_004b74a1:
      if (local_138._0_8_ != (long)local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,
                        (ulong)((long)&(((shared_ptr<const_bssl::ParsedCertificate> *)
                                        local_138._16_8_)->
                                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        (ulong)(local_100.field_2._M_allocated_capacity + 1));
      }
    }
LAB_004b74d3:
    anon_unknown_6::CertIssuerIterPath::Pop(local_e0);
LAB_004b74dd:
    bVar18 = true;
  }
  else {
LAB_004b6538:
    this_01 = local_c0;
    if ((this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::
        vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ::push_back((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     *)local_d0,(value_type *)this);
      }
    }
    else {
      anon_unknown_6::CertIssuerIterPath::CopyPath
                (&this->cur_path_,(ParsedCertificateList *)local_d0);
      this_01 = local_c0;
    }
    pCVar25 = CertPathErrors::GetOtherErrors(this_01);
    ppuVar31 = &cert_errors::kDeadlineExceeded;
LAB_004b71c3:
    CertErrors::AddError(pCVar25,*ppuVar31);
LAB_004b71ce:
    bVar18 = false;
  }
  return bVar18;
}

Assistant:

bool CertPathIter::GetNextPath(ParsedCertificateList *out_certs,
                               CertificateTrust *out_last_cert_trust,
                               CertPathErrors *out_errors,
                               CertPathBuilderDelegate *delegate,
                               uint32_t *iteration_count,
                               const uint32_t max_iteration_count,
                               const uint32_t max_path_building_depth) {
  out_certs->clear();
  *out_last_cert_trust = CertificateTrust::ForUnspecified();

  while (true) {
    if (delegate->IsDeadlineExpired()) {
      if (cur_path_.Empty()) {
        // If the deadline is already expired before the first call to
        // GetNextPath, cur_path_ will be empty. Return the leaf cert in that
        // case.
        if (next_issuer_.cert) {
          out_certs->push_back(next_issuer_.cert);
        }
      } else {
        cur_path_.CopyPath(out_certs);
      }
      out_errors->GetOtherErrors()->AddError(cert_errors::kDeadlineExceeded);
      return false;
    }

    // We are not done yet, so if the current path is at the depth limit then
    // we must backtrack to find an acceptable solution.
    if (max_path_building_depth > 0 &&
        cur_path_.Length() >= max_path_building_depth) {
      cur_path_.CopyPath(out_certs);
      out_errors->GetOtherErrors()->AddError(cert_errors::kDepthLimitExceeded);
      if (delegate->IsDebugLogEnabled()) {
        delegate->DebugLog(
            "CertPathIter reached depth limit. Returning "
            "partial path and backtracking:\n" +
            PathDebugString(*out_certs));
      }
      cur_path_.Pop();
      return true;
    }

    if (!next_issuer_.cert) {
      if (cur_path_.Empty()) {
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter exhausted all paths...");
        }
        return false;
      }

      (*iteration_count)++;
      if (max_iteration_count > 0 && *iteration_count > max_iteration_count) {
        cur_path_.CopyPath(out_certs);
        out_errors->GetOtherErrors()->AddError(
            cert_errors::kIterationLimitExceeded);
        return false;
      }

      cur_path_.back()->GetNextIssuer(&next_issuer_);
      if (!next_issuer_.cert) {
        if (!cur_path_.back()->had_non_skipped_issuers()) {
          // If the end of a path was reached without finding an anchor, return
          // the partial path before backtracking.
          cur_path_.CopyPath(out_certs);
          out_errors->GetErrorsForCert(out_certs->size() - 1)
              ->AddError(cert_errors::kNoIssuersFound);
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "CertPathIter returning partial path and backtracking:\n" +
                PathDebugString(*out_certs));
          }
          cur_path_.Pop();
          return true;
        } else {
          // No more issuers for current chain, go back up and see if there are
          // any more for the previous cert.
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog("CertPathIter backtracking...");
          }
          cur_path_.Pop();
          continue;
        }
      }
    }

    // Overrides for cert with trust appearing in the wrong place for the type
    // of trust (trusted leaf in non-leaf position, or trust anchor in leaf
    // position.)
    switch (next_issuer_.trust.type) {
      case CertificateTrustType::TRUSTED_ANCHOR:
        // If the leaf cert is trusted only as an anchor, treat it as having
        // unspecified trust. This may allow a successful path to be built to a
        // different root (or to the same cert if it's self-signed).
        if (cur_path_.Empty()) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Leaf is a trust anchor, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::TRUSTED_LEAF:
        // If a non-leaf cert is trusted only as a leaf, treat it as having
        // unspecified trust. This may allow a successful path to be built to a
        // trusted root.
        if (!cur_path_.Empty()) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Issuer is a trust leaf, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::UNSPECIFIED:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
        // No override necessary.
        break;
    }

    // Overrides for trusted leaf cert with require_leaf_selfsigned. If the leaf
    // isn't actually self-signed, treat it as unspecified.
    switch (next_issuer_.trust.type) {
      case CertificateTrustType::TRUSTED_LEAF:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
        if (cur_path_.Empty() && next_issuer_.trust.require_leaf_selfsigned &&
            !VerifyCertificateIsSelfSigned(*next_issuer_.cert,
                                           delegate->GetVerifyCache(),
                                           /*errors=*/nullptr)) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Leaf is trusted with require_leaf_selfsigned but is "
                "not self-signed, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::TRUSTED_ANCHOR:
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::UNSPECIFIED:
        // No override necessary.
        break;
    }

    switch (next_issuer_.trust.type) {
      // If the trust for this issuer is "known" (either because it is
      // distrusted, or because it is trusted) then stop building and return the
      // path.
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::TRUSTED_ANCHOR:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
      case CertificateTrustType::TRUSTED_LEAF: {
        // If the issuer has a known trust level, can stop building the path.
        cur_path_.CopyPath(out_certs);
        out_certs->push_back(std::move(next_issuer_.cert));
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter returning path:\n" +
                             PathDebugString(*out_certs));
        }
        *out_last_cert_trust = next_issuer_.trust;
        next_issuer_ = IssuerEntry();
        return true;
      }
      case CertificateTrustType::UNSPECIFIED: {
        // Skip this cert if it is already in the chain.
        if (cur_path_.IsPresent(next_issuer_.cert.get())) {
          cur_path_.back()->increment_skipped_issuer_count();
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog("CertPathIter skipping dupe cert: " +
                               CertDebugString(next_issuer_.cert.get()));
          }
          next_issuer_ = IssuerEntry();
          continue;
        }

        cur_path_.Append(std::make_unique<CertIssuersIter>(
            std::move(next_issuer_.cert), &cert_issuer_sources_, trust_store_));
        next_issuer_ = IssuerEntry();
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter cur_path_ =\n" +
                             cur_path_.PathDebugString());
        }
        // Continue descending the tree.
        continue;
      }
    }
  }
}